

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objnam.c
# Opt level: O0

char * makesingular(char *oldstr)

{
  int iVar1;
  char *pcVar2;
  char *str;
  char *bp;
  char *p;
  char *oldstr_local;
  
  str = nextobuf();
  if ((oldstr == (char *)0x0) || (*oldstr == '\0')) {
    warning("singular of null?");
    *str = '\0';
    oldstr_local = str;
  }
  else {
    strcpy(str,oldstr);
    for (; *str == ' '; str = str + 1) {
    }
    bp = strstri(str,"s of ");
    if (bp == (char *)0x0) {
      pcVar2 = eos(str);
      if ((pcVar2 < str + 1) || (pcVar2[-1] != 's')) {
        if ((str <= pcVar2 + -5) && (iVar1 = strcmp(pcVar2 + -5,"teeth"), iVar1 == 0)) {
          strcpy(pcVar2 + -5,"tooth");
          return str;
        }
        if ((str <= pcVar2 + -5) && (iVar1 = strcmp(pcVar2 + -5,"fungi"), iVar1 == 0)) {
          strcpy(pcVar2 + -5,"fungus");
          return str;
        }
      }
      else {
        if ((pcVar2 < str + 2) || (pcVar2[-2] != 'e')) {
          if (((((((str <= pcVar2 + -5) && (iVar1 = strcmp(pcVar2 + -5,"boots"), iVar1 == 0)) ||
                 ((str <= pcVar2 + -9 && (iVar1 = strcmp(pcVar2 + -9,"gauntlets"), iVar1 == 0)))) ||
                ((str <= pcVar2 + -6 && (iVar1 = strcmp(pcVar2 + -6,"tricks"), iVar1 == 0)))) ||
               ((((str <= pcVar2 + -9 && (iVar1 = strcmp(pcVar2 + -9,"paralysis"), iVar1 == 0)) ||
                 ((str <= pcVar2 + -5 && (iVar1 = strcmp(pcVar2 + -5,"glass"), iVar1 == 0)))) ||
                ((str <= pcVar2 + -4 && (iVar1 = strcmp(pcVar2 + -4,"ness"), iVar1 == 0)))))) ||
              ((str <= pcVar2 + -0xe && (iVar1 = strcmp(pcVar2 + -0xe,"shape changers"), iVar1 == 0)
               ))) || ((((str <= pcVar2 + -0xf &&
                         (iVar1 = strcmp(pcVar2 + -0xf,"detect monsters"), iVar1 == 0)) ||
                        ((str <= pcVar2 + -0xb &&
                         (iVar1 = strncasecmp(pcVar2 + -0xb,"Aesculapius",0xffffffffffffffff),
                         iVar1 == 0)))) ||
                       ((((str <= pcVar2 + -10 &&
                          (iVar1 = strcmp(pcVar2 + -10,"eucalyptus"), iVar1 == 0)) ||
                         ((str <= pcVar2 + -6 && (iVar1 = strcmp(pcVar2 + -6,"lembas"), iVar1 == 0))
                         )) || ((((str <= pcVar2 + -9 &&
                                  (iVar1 = strcmp(pcVar2 + -9,"iron bars"), iVar1 == 0)) ||
                                 ((str <= pcVar2 + -5 &&
                                  (iVar1 = strcmp(pcVar2 + -5,"aklys"), iVar1 == 0)))) ||
                                ((str <= pcVar2 + -6 &&
                                 (iVar1 = strcmp(pcVar2 + -6,"fungus"), iVar1 == 0)))))))))) {
            return str;
          }
        }
        else if ((pcVar2 < str + 3) || (pcVar2[-3] != 'i')) {
          if ((str <= pcVar2 + -6) && (iVar1 = strcmp(pcVar2 + -6,"knives"), iVar1 == 0)) {
            strcpy(pcVar2 + -3,"fe");
            return str;
          }
          if ((str <= pcVar2 + -6) && (iVar1 = strcmp(pcVar2 + -6,"staves"), iVar1 == 0)) {
            strcpy(pcVar2 + -3,"ff");
            return str;
          }
          if ((str <= pcVar2 + -6) &&
             (iVar1 = strncasecmp(pcVar2 + -6,"leaves",0xffffffffffffffff), iVar1 == 0)) {
            strcpy(pcVar2 + -3,"f");
            return str;
          }
          if ((str <= pcVar2 + -8) && (iVar1 = strcmp(pcVar2 + -8,"vortices"), iVar1 == 0)) {
            strcpy(pcVar2 + -4,"ex");
            return str;
          }
          if (((str <= pcVar2 + -5) && (iVar1 = strcmp(pcVar2 + -5,"boxes"), iVar1 == 0)) ||
             ((str <= pcVar2 + -4 && (iVar1 = strcmp(pcVar2 + -4,"ches"), iVar1 == 0)))) {
            pcVar2[-2] = '\0';
            return str;
          }
          if ((((str <= pcVar2 + -6) && (iVar1 = strcmp(pcVar2 + -6,"gloves"), iVar1 == 0)) ||
              ((str <= pcVar2 + -6 && (iVar1 = strcmp(pcVar2 + -6,"lenses"), iVar1 == 0)))) ||
             (((str <= pcVar2 + -5 && (iVar1 = strcmp(pcVar2 + -5,"shoes"), iVar1 == 0)) ||
              ((str <= pcVar2 + -6 && (iVar1 = strcmp(pcVar2 + -6,"scales"), iVar1 == 0)))))) {
            return str;
          }
        }
        else if (((pcVar2 + -7 < str) || (iVar1 = strcmp(pcVar2 + -7,"cookies"), iVar1 != 0)) &&
                ((pcVar2 + -4 < str || (iVar1 = strcmp(pcVar2 + -4,"pies"), iVar1 != 0)))) {
          strcpy(pcVar2 + -3,"y");
          return str;
        }
        pcVar2[-1] = '\0';
      }
      oldstr_local = str;
    }
    else {
      if (((bp + -3 < str) || (iVar1 = strncasecmp(bp + -3,"Eye",3), iVar1 != 0)) &&
         (((bp + -4 < str || (iVar1 = strncmp(bp + -4,"boot",4), iVar1 != 0)) &&
          ((bp + -8 < str || (iVar1 = strncmp(bp + -8,"gauntlet",8), iVar1 != 0)))))) {
        for (; *bp = bp[1], bp[1] != '\0'; bp = bp + 1) {
        }
      }
      oldstr_local = str;
    }
  }
  return oldstr_local;
}

Assistant:

char *makesingular(const char *oldstr)
{
	char *p, *bp;
	char *str = nextobuf();

	if (!oldstr || !*oldstr) {
		warning("singular of null?");
		str[0] = 0;
		return str;
	}
	strcpy(str, oldstr);
	bp = str;

	while (*bp == ' ') bp++;
	/* find "cloves of garlic", "worthless pieces of blue glass" */
	if ((p = strstri(bp, "s of ")) != 0) {
	    /* but don't singularize "gauntlets", "boots", "Eyes of the.." */
	    if (BSTRNCMPI(bp, p-3, "Eye", 3) &&
		BSTRNCMP(bp, p-4, "boot", 4) &&
		BSTRNCMP(bp, p-8, "gauntlet", 8))
		while ((*p = *(p+1)) != 0) p++;
	    return bp;
	}

	/* remove -s or -es (boxes) or -ies (rubies) */
	p = eos(bp);
	if (p >= bp+1 && p[-1] == 's') {
		if (p >= bp+2 && p[-2] == 'e') {
			if (p >= bp+3 && p[-3] == 'i') {
				if (!BSTRCMP(bp, p-7, "cookies") ||
				   !BSTRCMP(bp, p-4, "pies"))
					goto mins;
				strcpy(p-3, "y");
				return bp;
			}

			/* note: cloves / knives from clove / knife */
			if (!BSTRCMP(bp, p-6, "knives")) {
				strcpy(p-3, "fe");
				return bp;
			}
			if (!BSTRCMP(bp, p-6, "staves")) {
				strcpy(p-3, "ff");
				return bp;
			}
			if (!BSTRCMPI(bp, p-6, "leaves")) {
				strcpy(p-3, "f");
				return bp;
			}
			if (!BSTRCMP(bp, p-8, "vortices")) {
				strcpy(p-4, "ex");
				return bp;
			}

			/* note: nurses, axes but boxes */
			if (!BSTRCMP(bp, p-5, "boxes") ||
			    !BSTRCMP(bp, p-4, "ches")) {
				p[-2] = '\0';
				return bp;
			}

			if (!BSTRCMP(bp, p-6, "gloves") ||
			    !BSTRCMP(bp, p-6, "lenses") ||
			    !BSTRCMP(bp, p-5, "shoes") ||
			    !BSTRCMP(bp, p-6, "scales"))
				return bp;

		} else if (!BSTRCMP(bp, p-5, "boots") ||
			   !BSTRCMP(bp, p-9, "gauntlets") ||
			   !BSTRCMP(bp, p-6, "tricks") ||
			   !BSTRCMP(bp, p-9, "paralysis") ||
			   !BSTRCMP(bp, p-5, "glass") ||
			   !BSTRCMP(bp, p-4, "ness") ||
			   !BSTRCMP(bp, p-14, "shape changers") ||
			   !BSTRCMP(bp, p-15, "detect monsters") ||
			   !BSTRCMPI(bp, p-11, "Aesculapius") || /* staff */
			   !BSTRCMP(bp, p-10, "eucalyptus") ||
			   !BSTRCMP(bp, p-6, "lembas") ||
			   !BSTRCMP(bp, p-9, "iron bars") ||
			   !BSTRCMP(bp, p-5, "aklys") ||
			   !BSTRCMP(bp, p-6, "fungus"))
				return bp;
	mins:
		p[-1] = '\0';

	} else {

		if (!BSTRCMP(bp, p-5, "teeth")) {
			strcpy(p-5, "tooth");
			return bp;
		}

		if (!BSTRCMP(bp, p-5, "fungi")) {
			strcpy(p-5, "fungus");
			return bp;
		}

		/* here we cannot find the plural suffix */
	}
	return bp;
}